

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob-test.c++
# Opt level: O1

void __thiscall capnp::anon_unknown_0::TestCase79::run(TestCase79 *this)

{
  return;
}

Assistant:

TEST(Blob, Compare) {
  EXPECT_TRUE (Text::Reader("foo") == Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("foo") != Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("foo") <= Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("foo") >= Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("foo") <  Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("foo") >  Text::Reader("foo"));

  EXPECT_FALSE(Text::Reader("foo") == Text::Reader("bar"));
  EXPECT_TRUE (Text::Reader("foo") != Text::Reader("bar"));
  EXPECT_FALSE(Text::Reader("foo") <= Text::Reader("bar"));
  EXPECT_TRUE (Text::Reader("foo") >= Text::Reader("bar"));
  EXPECT_FALSE(Text::Reader("foo") <  Text::Reader("bar"));
  EXPECT_TRUE (Text::Reader("foo") >  Text::Reader("bar"));

  EXPECT_FALSE(Text::Reader("bar") == Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("bar") != Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("bar") <= Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("bar") >= Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("bar") <  Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("bar") >  Text::Reader("foo"));

  EXPECT_FALSE(Text::Reader("foobar") == Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("foobar") != Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("foobar") <= Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("foobar") >= Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("foobar") <  Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("foobar") >  Text::Reader("foo"));

  EXPECT_FALSE(Text::Reader("foo") == Text::Reader("foobar"));
  EXPECT_TRUE (Text::Reader("foo") != Text::Reader("foobar"));
  EXPECT_TRUE (Text::Reader("foo") <= Text::Reader("foobar"));
  EXPECT_FALSE(Text::Reader("foo") >= Text::Reader("foobar"));
  EXPECT_TRUE (Text::Reader("foo") <  Text::Reader("foobar"));
  EXPECT_FALSE(Text::Reader("foo") >  Text::Reader("foobar"));
}